

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O3

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_BluesRec *pPVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  PSH_BluesRec *pPVar6;
  PSH_Blue_ZoneRec *pPVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  FT_Pos *pFVar13;
  FT_UInt FVar14;
  int iVar15;
  
  if ((globals->dimension[0].scale_mult != x_scale) ||
     (globals->dimension[0].scale_delta != x_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((globals->dimension[1].scale_mult != y_scale) ||
     (globals->dimension[1].scale_delta != y_delta)) {
    globals->dimension[1].scale_mult = y_scale;
    globals->dimension[1].scale_delta = y_delta;
    psh_globals_scale_widths(globals,1);
    if (y_scale < 0x20c49ba) {
      bVar3 = y_scale * 0x7d < (globals->blues).blue_scale * 8;
    }
    else {
      bVar3 = y_scale < ((globals->blues).blue_scale << 3) / 0x7d;
    }
    (globals->blues).no_overshoots = bVar3;
    uVar5 = (globals->blues).blue_shift;
    lVar4 = (long)(int)y_scale;
    if (0 < (int)uVar5) {
      do {
        if ((int)((ulong)uVar5 * lVar4 + ((long)((ulong)uVar5 * lVar4) >> 0x3f) + 0x8000 >> 0x10) <
            0x21) goto LAB_00211ee9;
        bVar3 = 1 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar3);
      uVar5 = 0;
    }
LAB_00211ee9:
    pPVar1 = &globals->blues;
    (globals->blues).blue_threshold = uVar5;
    iVar8 = 0;
    do {
      pPVar6 = pPVar1;
      if (((iVar8 != 0) && (pPVar6 = (PSH_BluesRec *)&(globals->blues).family_top, iVar8 != 2)) &&
         (pPVar6 = (PSH_BluesRec *)&(globals->blues).normal_bottom, iVar8 != 1)) {
        pPVar6 = (PSH_BluesRec *)&(globals->blues).family_bottom;
      }
      FVar14 = (pPVar6->normal_top).count;
      if (FVar14 != 0) {
        pPVar7 = (pPVar6->normal_top).zones;
        do {
          lVar10 = pPVar7->org_top * lVar4;
          pPVar7->cur_top = (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10) + y_delta;
          lVar10 = pPVar7->org_bottom * lVar4;
          pPVar7->cur_bottom = (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10) + y_delta;
          lVar10 = pPVar7->org_ref * lVar4;
          lVar12 = pPVar7->org_delta * lVar4;
          pPVar7->cur_delta = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
          pPVar7->cur_ref =
               (long)(int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10) + y_delta + 0x20 &
               0xffffffffffffffc0;
          pPVar7 = pPVar7 + 1;
          FVar14 = FVar14 - 1;
        } while (FVar14 != 0);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    bVar3 = true;
    do {
      bVar2 = bVar3;
      pPVar6 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
      if (bVar2) {
        pPVar6 = pPVar1;
      }
      FVar14 = (pPVar6->normal_top).count;
      if (FVar14 != 0) {
        pPVar7 = (pPVar6->normal_top).zones;
        lVar10 = 0x918;
        if (bVar2) {
          lVar10 = 0x610;
        }
        iVar8 = *(int *)((long)(pPVar1->normal_top).zones + lVar10 + -8);
        do {
          if (iVar8 != 0) {
            pFVar13 = (FT_Pos *)((long)&(globals->blues).normal_top.zones[0].cur_top + lVar10);
            iVar9 = iVar8;
            do {
              iVar15 = pPVar7->org_ref - (int)pFVar13[-5];
              iVar11 = -iVar15;
              if (0 < iVar15) {
                iVar11 = iVar15;
              }
              if ((int)((ulong)(iVar11 * lVar4 + (iVar11 * lVar4 >> 0x3f) + 0x8000) >> 0x10) < 0x40)
              {
                pPVar7->cur_top = *pFVar13;
                pPVar7->cur_bottom = pFVar13[-1];
                pPVar7->cur_ref = pFVar13[-3];
                pPVar7->cur_delta = pFVar13[-2];
                break;
              }
              pFVar13 = pFVar13 + 6;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          pPVar7 = pPVar7 + 1;
          FVar14 = FVar14 - 1;
        } while (FVar14 != 0);
      }
      bVar3 = false;
    } while (bVar2);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }